

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputBase::Setup(BasicInputBase *this)

{
  Vector<float,_4> local_24;
  int local_14;
  BasicInputBase *pBStack_10;
  int i;
  BasicInputBase *this_local;
  
  this->m_po = 0;
  pBStack_10 = this;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
    tcu::Vector<float,_4>::Vector(&local_24,0.0);
    *(undefined8 *)this->expected_data[local_14].m_data = local_24.m_data._0_8_;
    *(undefined8 *)(this->expected_data[local_14].m_data + 2) = local_24.m_data._8_8_;
  }
  this->instance_count = 1;
  this->base_instance = -1;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i			 = 0; i < 64; ++i)
			expected_data[i] = Vec4(0.0f);
		instance_count		 = 1;
		base_instance		 = -1;
		return NO_ERROR;
	}